

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommands.cpp
# Opt level: O2

void __thiscall
DataCommands::DataCommands
          (DataCommands *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *separated)

{
  pthread_mutex_t *mutex;
  DataVars *this_00;
  DataBinds *this_01;
  OpenDataServerCommand *pOVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_68;
  OpenDataServerCommand *local_40;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_38;
  
  (this->separated).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->index = 0;
  (this->separated).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->separated).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->stringsToCommands;
  (this->stringsToCommands)._M_h._M_buckets = &(this->stringsToCommands)._M_h._M_single_bucket;
  (this->stringsToCommands)._M_h._M_bucket_count = 1;
  (this->stringsToCommands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->stringsToCommands)._M_h._M_element_count = 0;
  (this->stringsToCommands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stringsToCommands)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->stringsToCommands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->separated,separated);
  this_00 = (DataVars *)operator_new(0x58);
  DataVars::DataVars(this_00);
  this_01 = (DataBinds *)operator_new(0x38);
  DataBinds::DataBinds(this_01);
  mutex = &this->mutex;
  pthread_mutex_init((pthread_mutex_t *)mutex,(pthread_mutexattr_t *)0x0);
  pOVar1 = (OpenDataServerCommand *)operator_new(0x78);
  OpenDataServerCommand::OpenDataServerCommand(pOVar1,this,this_01,this_00,mutex);
  local_40 = pOVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[15],_OpenDataServerCommand_*,_true>
            (&local_68,(char (*) [15])"openDataServer",&local_40);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pOVar1 = (OpenDataServerCommand *)operator_new(0x78);
  ConnectCommand::ConnectCommand((ConnectCommand *)pOVar1,this,this_01,this_00,mutex);
  local_40 = pOVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[8],_ConnectCommand_*,_true>
            (&local_68,(char (*) [8])"connect",(ConnectCommand **)&local_40);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pOVar1 = (OpenDataServerCommand *)operator_new(0x18);
  VarCommand::VarCommand((VarCommand *)pOVar1,this,this_00);
  local_40 = pOVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[4],_VarCommand_*,_true>
            (&local_68,(char (*) [4])"var",(VarCommand **)&local_40);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pOVar1 = (OpenDataServerCommand *)operator_new(0x18);
  BindCommand::BindCommand((BindCommand *)pOVar1,this,this_01);
  local_40 = pOVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[5],_BindCommand_*,_true>
            (&local_68,(char (*) [5])"bind",(BindCommand **)&local_40);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pOVar1 = (OpenDataServerCommand *)operator_new(0x30);
  WhileCommand::WhileCommand((WhileCommand *)pOVar1,this,this_00);
  local_40 = pOVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[6],_WhileCommand_*,_true>
            (&local_68,(char (*) [6])"while",(WhileCommand **)&local_40);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pOVar1 = (OpenDataServerCommand *)operator_new(0x30);
  IfCommand::IfCommand((IfCommand *)pOVar1,this,this_00);
  local_40 = pOVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[3],_IfCommand_*,_true>(&local_68,(char (*) [3])"if",(IfCommand **)&local_40);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pOVar1 = (OpenDataServerCommand *)operator_new(0x18);
  PrintCommand::PrintCommand((PrintCommand *)pOVar1,this,this_00);
  local_40 = pOVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[6],_PrintCommand_*,_true>
            (&local_68,(char (*) [6])"print",(PrintCommand **)&local_40);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pOVar1 = (OpenDataServerCommand *)operator_new(0x18);
  EqualCommand::EqualCommand((EqualCommand *)pOVar1,this,this_00);
  local_40 = pOVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[2],_EqualCommand_*,_true>
            (&local_68,(char (*) [2])0x11d695,(EqualCommand **)&local_40);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pOVar1 = (OpenDataServerCommand *)operator_new(0x10);
  EntercCommand::EntercCommand((EntercCommand *)pOVar1,this);
  local_40 = pOVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[7],_EntercCommand_*,_true>
            (&local_68,(char (*) [7])"enterc",(EntercCommand **)&local_40);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pOVar1 = (OpenDataServerCommand *)operator_new(0x18);
  SleepCommand::SleepCommand((SleepCommand *)pOVar1,this,this_00);
  local_40 = pOVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[6],_SleepCommand_*,_true>
            (&local_68,(char (*) [6])"sleep",(SleepCommand **)&local_40);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Command*>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,Command*>>(local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

DataCommands::DataCommands(vector<string> &separated) {
    this->index = 0;
    this->separated = separated;

    DataVars *dataVars;
    dataVars = new DataVars();

    DataBinds *dataBinds;
    dataBinds = new DataBinds();

    pthread_mutex_init(&this->mutex, nullptr);

    this->stringsToCommands.insert(
            pair<string, Command *>("openDataServer", new OpenDataServerCommand(this, dataBinds, dataVars, mutex)));
    this->stringsToCommands.insert(
            pair<string, Command *>("connect", new ConnectCommand(this, dataBinds, dataVars, mutex)));
    this->stringsToCommands.insert(pair<string, Command *>("var", new VarCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("bind", new BindCommand(this, dataBinds)));
    this->stringsToCommands.insert(pair<string, Command *>("while", new WhileCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("if", new IfCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("print", new PrintCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("=", new EqualCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("enterc", new EntercCommand(this)));
    this->stringsToCommands.insert(pair<string, Command *>("sleep", new SleepCommand(this, dataVars)));
}